

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.c
# Opt level: O1

int64_t sysbvm_time_microsecondsTimestamp(void)

{
  timespec ts;
  timespec local_18;
  
  local_18.tv_sec = 0;
  local_18.tv_nsec = 0;
  clock_gettime(1,&local_18);
  return local_18.tv_nsec / 1000 + local_18.tv_sec * 1000000;
}

Assistant:

SYSBVM_API int64_t sysbvm_time_microsecondsTimestamp(void)
{
#ifdef _WIN32
    LARGE_INTEGER timestamp = {0};
    LARGE_INTEGER timestampFrequency = {0};
    if(!QueryPerformanceCounter(&timestamp) || !QueryPerformanceFrequency(&timestampFrequency))
        return 0;

    int64_t frequencyDivisor = timestampFrequency.QuadPart / (int64_t)1000000;
    return timestamp.QuadPart / frequencyDivisor;
#else
    struct timespec ts = {};
    clock_gettime(CLOCK_MONOTONIC, &ts);
    return (int64_t)ts.tv_sec * (int64_t)1000000 + (int64_t)ts.tv_nsec / (int64_t)1000; 
#endif
}